

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fkLookupParent(Parse *pParse,int iDb,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,int regData
                   ,int nIncr,int isIgnore)

{
  byte bVar1;
  uint nReg;
  int iVar2;
  int p2;
  int iVar3;
  int p3;
  int iVar4;
  Vdbe *p;
  char *zP4;
  Parse *pPVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  p = sqlite3GetVdbe(pParse);
  iVar6 = pParse->nTab;
  p2 = pParse->nLabel + -1;
  pParse->nLabel = p2;
  if (nIncr < 0) {
    sqlite3VdbeAddOp2(p,0x2e,(uint)pFKey->isDeferred,p2);
  }
  iVar6 = iVar6 + -1;
  iVar7 = regData + 1;
  for (lVar8 = 0; nReg = pFKey->nCol, lVar8 < (int)nReg; lVar8 = lVar8 + 1) {
    sqlite3VdbeAddOp2(p,0x32,aiCol[lVar8] + iVar7,p2);
  }
  if (isIgnore == 0) {
    if (pIdx == (Index *)0x0) {
      iVar3 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(p,0x4f,iVar7 + *aiCol,iVar3);
      iVar7 = sqlite3VdbeAddOp2(p,0xf,iVar3,0);
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        sqlite3VdbeAddOp3(p,0x35,regData,p2,iVar3);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = 0x90;
        }
      }
      sqlite3OpenTable(pParse,iVar6,iDb,pTab,0x6c);
      sqlite3VdbeAddOp3(p,0x1f,iVar6,0,iVar3);
      sqlite3VdbeGoto(p,p2);
      sqlite3VdbeJumpHere(p,p->nOp + -2);
      sqlite3VdbeJumpHere(p,iVar7);
      if (iVar3 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar3;
        }
      }
    }
    else {
      iVar3 = sqlite3GetTempRange(pParse,nReg);
      p3 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(p,0x6c,iVar6,pIdx->tnum,iDb);
      sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
      uVar9 = 0;
      uVar10 = 0;
      if (0 < (int)nReg) {
        uVar10 = (ulong)nReg;
      }
      for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        sqlite3VdbeAddOp2(p,0x4e,aiCol[uVar9] + iVar7,iVar3 + (int)uVar9);
      }
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        iVar2 = p->nOp;
        for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
          iVar4 = 0;
          if (pIdx->aiColumn[uVar9] != pTab->iPKey) {
            iVar4 = pIdx->aiColumn[uVar9] + 1;
          }
          sqlite3VdbeAddOp3(p,0x34,aiCol[uVar9] + iVar7,iVar2 + nReg + 1,iVar4 + regData);
          if (0 < (long)p->nOp) {
            p->aOp[(long)p->nOp + -1].p5 = 0x10;
          }
        }
        sqlite3VdbeGoto(p,p2);
      }
      zP4 = sqlite3IndexAffinityStr(pParse->db,pIdx);
      sqlite3VdbeAddOp4(p,0x5c,iVar3,nReg,p3,zP4,nReg);
      sqlite3VdbeAddOp4Int(p,0x1d,iVar6,p2,p3,0);
      if (p3 != 0) {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = p3;
        }
      }
      sqlite3ReleaseTempRange(pParse,iVar3,nReg);
    }
  }
  bVar1 = pFKey->isDeferred;
  if (bVar1 == 0) {
    if ((((pParse->db->flags & 0x80000) == 0) && (pParse->pToplevel == (Parse *)0x0)) &&
       (pParse->isMultiWrite == '\0')) {
      sqlite3HaltConstraint(pParse,0x313,2,(char *)0x0,-1,'\x04');
      goto LAB_001a7162;
    }
    if (0 < nIncr) {
      pPVar5 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar5 = pParse;
      }
      pPVar5->mayAbort = '\x01';
    }
  }
  sqlite3VdbeAddOp2(p,0x96,(uint)bVar1,nIncr);
LAB_001a7162:
  sqlite3VdbeResolveLabel(p,p2);
  sqlite3VdbeAddOp1(p,0x75,iVar6);
  return;
}

Assistant:

static void fkLookupParent(
  Parse *pParse,        /* Parse context */
  int iDb,              /* Index of database housing pTab */
  Table *pTab,          /* Parent table of FK pFKey */
  Index *pIdx,          /* Unique index on parent key columns in pTab */
  FKey *pFKey,          /* Foreign key constraint */
  int *aiCol,           /* Map from parent key columns to child table columns */
  int regData,          /* Address of array containing child table row */
  int nIncr,            /* Increment constraint counter by this */
  int isIgnore          /* If true, pretend pTab contains all NULL values */
){
  int i;                                    /* Iterator variable */
  Vdbe *v = sqlite3GetVdbe(pParse);         /* Vdbe to add code to */
  int iCur = pParse->nTab - 1;              /* Cursor number to use */
  int iOk = sqlite3VdbeMakeLabel(pParse);   /* jump here if parent key found */

  sqlite3VdbeVerifyAbortable(v,
    (!pFKey->isDeferred
      && !(pParse->db->flags & SQLITE_DeferFKs)
      && !pParse->pToplevel 
      && !pParse->isMultiWrite) ? OE_Abort : OE_Ignore);

  /* If nIncr is less than zero, then check at runtime if there are any
  ** outstanding constraints to resolve. If there are not, there is no need
  ** to check if deleting this row resolves any outstanding violations.
  **
  ** Check if any of the key columns in the child table row are NULL. If 
  ** any are, then the constraint is considered satisfied. No need to 
  ** search for a matching row in the parent table.  */
  if( nIncr<0 ){
    sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, iOk);
    VdbeCoverage(v);
  }
  for(i=0; i<pFKey->nCol; i++){
    int iReg = aiCol[i] + regData + 1;
    sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iOk); VdbeCoverage(v);
  }

  if( isIgnore==0 ){
    if( pIdx==0 ){
      /* If pIdx is NULL, then the parent key is the INTEGER PRIMARY KEY
      ** column of the parent table (table pTab).  */
      int iMustBeInt;               /* Address of MustBeInt instruction */
      int regTemp = sqlite3GetTempReg(pParse);
  
      /* Invoke MustBeInt to coerce the child key value to an integer (i.e. 
      ** apply the affinity of the parent key). If this fails, then there
      ** is no matching parent key. Before using MustBeInt, make a copy of
      ** the value. Otherwise, the value inserted into the child key column
      ** will have INTEGER affinity applied to it, which may not be correct.  */
      sqlite3VdbeAddOp2(v, OP_SCopy, aiCol[0]+1+regData, regTemp);
      iMustBeInt = sqlite3VdbeAddOp2(v, OP_MustBeInt, regTemp, 0);
      VdbeCoverage(v);
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter.  */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        sqlite3VdbeAddOp3(v, OP_Eq, regData, iOk, regTemp); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
      }
  
      sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenRead);
      sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regTemp); VdbeCoverage(v);
      sqlite3VdbeGoto(v, iOk);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      sqlite3VdbeJumpHere(v, iMustBeInt);
      sqlite3ReleaseTempReg(pParse, regTemp);
    }else{
      int nCol = pFKey->nCol;
      int regTemp = sqlite3GetTempRange(pParse, nCol);
      int regRec = sqlite3GetTempReg(pParse);
  
      sqlite3VdbeAddOp3(v, OP_OpenRead, iCur, pIdx->tnum, iDb);
      sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
      for(i=0; i<nCol; i++){
        sqlite3VdbeAddOp2(v, OP_Copy, aiCol[i]+1+regData, regTemp+i);
      }
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter. 
      **
      ** If any of the parent-key values are NULL, then the row cannot match 
      ** itself. So set JUMPIFNULL to make sure we do the OP_Found if any
      ** of the parent-key values are NULL (at this point it is known that
      ** none of the child key values are).
      */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        int iJump = sqlite3VdbeCurrentAddr(v) + nCol + 1;
        for(i=0; i<nCol; i++){
          int iChild = aiCol[i]+1+regData;
          int iParent = pIdx->aiColumn[i]+1+regData;
          assert( pIdx->aiColumn[i]>=0 );
          assert( aiCol[i]!=pTab->iPKey );
          if( pIdx->aiColumn[i]==pTab->iPKey ){
            /* The parent key is a composite key that includes the IPK column */
            iParent = regData;
          }
          sqlite3VdbeAddOp3(v, OP_Ne, iChild, iJump, iParent); VdbeCoverage(v);
          sqlite3VdbeChangeP5(v, SQLITE_JUMPIFNULL);
        }
        sqlite3VdbeGoto(v, iOk);
      }
  
      sqlite3VdbeAddOp4(v, OP_MakeRecord, regTemp, nCol, regRec,
                        sqlite3IndexAffinityStr(pParse->db,pIdx), nCol);
      sqlite3VdbeAddOp4Int(v, OP_Found, iCur, iOk, regRec, 0); VdbeCoverage(v);
  
      sqlite3ReleaseTempReg(pParse, regRec);
      sqlite3ReleaseTempRange(pParse, regTemp, nCol);
    }
  }

  if( !pFKey->isDeferred && !(pParse->db->flags & SQLITE_DeferFKs)
   && !pParse->pToplevel 
   && !pParse->isMultiWrite 
  ){
    /* Special case: If this is an INSERT statement that will insert exactly
    ** one row into the table, raise a constraint immediately instead of
    ** incrementing a counter. This is necessary as the VM code is being
    ** generated for will not open a statement transaction.  */
    assert( nIncr==1 );
    sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
        OE_Abort, 0, P4_STATIC, P5_ConstraintFK);
  }else{
    if( nIncr>0 && pFKey->isDeferred==0 ){
      sqlite3MayAbort(pParse);
    }
    sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
  }

  sqlite3VdbeResolveLabel(v, iOk);
  sqlite3VdbeAddOp1(v, OP_Close, iCur);
}